

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaAllocator.cpp
# Opt level: O2

void * Memory::InPlaceFreeListPolicy::New
                 (ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *allocator)

{
  FreeObject **ppFVar1;
  
  ppFVar1 = AllocateArray<Memory::ArenaAllocator,Memory::InPlaceFreeListPolicy::FreeObject*,true>
                      ((Memory *)allocator,
                       (ArenaAllocator *)ArenaAllocator::NoThrowNoRecoveryAllocZero,0,
                       (ulong)allocator->needsDelayFreeList * 0x40 + 0x40);
  return ppFVar1;
}

Assistant:

void * InPlaceFreeListPolicy::New(ArenaAllocatorBase<InPlaceFreeListPolicy> * allocator)
{
#if DBG
    // Allocate freeList followed by delayFreeList
    // A delayFreeList will enable us to detect use-after free scenarios in debug builds
    if (allocator->HasDelayFreeList())
    {
        return AllocatorNewNoThrowNoRecoveryArrayZ(ArenaAllocator, allocator, FreeObject *, 2 * buckets);
    }
#endif
    return AllocatorNewNoThrowNoRecoveryArrayZ(ArenaAllocator, allocator, FreeObject *, buckets);
}